

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramSetClear(VP8LHistogramSet *set)

{
  size_t __n;
  int *in_RDI;
  uint8_t *memory;
  size_t total_size;
  int size;
  int cache_bits;
  int i;
  undefined8 in_stack_ffffffffffffffe0;
  int cache_bits_00;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  uVar1 = *(undefined4 *)(**(long **)(in_RDI + 2) + 0xca8);
  cache_bits_00 = in_RDI[1];
  __n = HistogramSetTotalSize
                  ((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0);
  memset(in_RDI,0,__n);
  *(int **)(in_RDI + 2) = in_RDI + 4;
  in_RDI[1] = cache_bits_00;
  *in_RDI = cache_bits_00;
  HistogramSetResetPointers
            ((VP8LHistogramSet *)CONCAT44(in_stack_fffffffffffffff4,uVar1),cache_bits_00);
  for (iVar2 = 0; iVar2 < cache_bits_00; iVar2 = iVar2 + 1) {
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 2) + (long)iVar2 * 8) + 0xca8) = uVar1;
  }
  return;
}

Assistant:

void VP8LHistogramSetClear(VP8LHistogramSet* const set) {
  int i;
  const int cache_bits = set->histograms[0]->palette_code_bits_;
  const int size = set->max_size;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)set;

  memset(memory, 0, total_size);
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    set->histograms[i]->palette_code_bits_ = cache_bits;
  }
}